

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

Options * __thiscall
ApprovalTests::Options::withReporter
          (Options *__return_storage_ptr__,Options *this,Reporter *reporter)

{
  bool usingDefaultScrubber;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<ApprovalTests::ApprovalNamer> local_78;
  _Any_data local_68;
  code *local_58;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_30 [16];
  
  local_48 = (undefined1  [8])(this->fileOptions_).options_;
  pcVar1 = (this->fileOptions_).fileExtensionWithDot_._M_dataplus._M_p;
  local_40._M_p = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,
             pcVar1 + (this->fileOptions_).fileExtensionWithDot_._M_string_length);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_68,&this->scrubber_);
  usingDefaultScrubber = this->usingDefaultScrubber_;
  local_78.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->namer_).super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  this_00 = (this->namer_).
            super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  local_78.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Options(__return_storage_ptr__,(FileOptions *)local_48,(Scrubber *)&local_68,reporter,
            usingDefaultScrubber,&local_78);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      Options(__return_storage_ptr__,(FileOptions *)local_48,(Scrubber *)&local_68,reporter,
              usingDefaultScrubber,&local_78);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0017b10e;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      Options(__return_storage_ptr__,(FileOptions *)local_48,(Scrubber *)&local_68,reporter,
              usingDefaultScrubber,&local_78);
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0017b10e:
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Options Options::withReporter(const Reporter& reporter) const
    {
        return Options(fileOptions_, scrubber_, reporter, usingDefaultScrubber_, namer_);
    }